

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void deqp::gles31::Functional::checkRenderTargetSize(RenderTarget *renderTarget,int minSize)

{
  int iVar1;
  NotSupportedError *this;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  RenderTarget *pRStack_10;
  int minSize_local;
  RenderTarget *renderTarget_local;
  
  local_14 = minSize;
  pRStack_10 = renderTarget;
  iVar1 = tcu::RenderTarget::getWidth(renderTarget);
  if (local_14 <= iVar1) {
    iVar1 = tcu::RenderTarget::getHeight(pRStack_10);
    if (local_14 <= iVar1) {
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_58,&local_14);
  std::operator+(&local_38,"Render target width and height must be at least ",&local_58);
  tcu::NotSupportedError::NotSupportedError(this,&local_38);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

static inline void checkRenderTargetSize (const RenderTarget& renderTarget, int minSize)
{
	if (renderTarget.getWidth() < minSize || renderTarget.getHeight() < minSize)
		throw tcu::NotSupportedError("Render target width and height must be at least " + de::toString(minSize));
}